

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  int size;
  int iVar1;
  xmlNodeSetPtr cur;
  xmlHashTablePtr hash;
  xmlChar *key;
  void *pvVar2;
  long lVar3;
  xmlNodePtr cur_00;
  
  if (nodes != (xmlNodeSetPtr)0x0) {
    if (nodes->nodeNr == 0) {
      return nodes;
    }
    if (nodes->nodeTab == (xmlNodePtr *)0x0) {
      return nodes;
    }
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur != (xmlNodeSetPtr)0x0) {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
      size = nodes->nodeNr;
      hash = xmlHashCreate(size);
      if (0 < (long)size) {
        lVar3 = 0;
        do {
          if (lVar3 < nodes->nodeNr) {
            cur_00 = nodes->nodeTab[lVar3];
          }
          else {
            cur_00 = (xmlNode *)0x0;
          }
          key = xmlNodeGetContent(cur_00);
          pvVar2 = xmlHashLookup(hash,key);
          if (pvVar2 == (void *)0x0) {
            iVar1 = xmlHashAddEntry(hash,key,key);
            if (iVar1 < 0) {
              (*xmlFree)(key);
LAB_001bae32:
              xmlHashFree(hash,xmlHashDefaultDeallocator);
              xmlXPathFreeNodeSet(cur);
              return (xmlNodeSetPtr)0x0;
            }
            iVar1 = xmlXPathNodeSetAddUnique(cur,cur_00);
            if (iVar1 < 0) goto LAB_001bae32;
          }
          else {
            (*xmlFree)(key);
          }
          lVar3 = lVar3 + 1;
        } while (size != lVar3);
      }
      xmlHashFree(hash,xmlHashDefaultDeallocator);
      return cur;
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    if (xmlHashAddEntry(hash, strval, strval) < 0) {
                xmlFree(strval);
                goto error;
            }
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        goto error;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);

error:
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    xmlXPathFreeNodeSet(ret);
    return(NULL);
}